

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O2

int __thiscall kj::_::Debug::Fault::init(Fault *this,EVP_PKEY_CTX *ctx)

{
  ArrayPtr<kj::String> argValues;
  int extraout_EAX;
  Exception *this_00;
  ulong uVar1;
  uint in_ECX;
  int in_EDX;
  Type type;
  DescriptionStyle in_R8D;
  char *in_R9;
  char *sysErrorString;
  char *in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined4 in_stack_ffffffffffffffa8;
  Array<char> local_48;
  
  sysErrorString = in_R9;
  this_00 = (Exception *)operator_new(0x158);
  type = OVERLOADED;
  uVar1 = (ulong)(in_ECX - 0x57);
  if (in_ECX - 0x57 < 0x24) {
    if ((0x713e000UL >> (uVar1 & 0x3f) & 1) == 0) {
      if ((0x800840001U >> (uVar1 & 0x3f) & 1) != 0) goto LAB_00176167;
      if ((0x122UL >> (uVar1 & 0x3f) & 1) == 0) goto LAB_0017613a;
LAB_00176164:
      type = UNIMPLEMENTED;
      goto LAB_00176167;
    }
LAB_0017611b:
    type = DISCONNECTED;
  }
  else {
LAB_0017613a:
    uVar1 = (ulong)(in_ECX - 0xc);
    if (in_ECX - 0xc < 0x35) {
      if ((0x2011801UL >> (uVar1 & 0x3f) & 1) != 0) goto LAB_00176167;
      if ((0x10000000100000U >> (uVar1 & 0x3f) & 1) != 0) goto LAB_0017611b;
      if (uVar1 == 0x1a) goto LAB_00176164;
    }
    type = FAILED;
  }
LAB_00176167:
  argValues.size_._0_4_ = in_stack_ffffffffffffffa8;
  argValues.ptr = (String *)in_stack_00000010;
  argValues.size_._4_4_ = in_EDX;
  anon_unknown_2::makeDescriptionImpl
            ((String *)&local_48,(anon_unknown_2 *)0x2,in_R8D,(char *)(ulong)in_ECX,(int)in_R9,
             sysErrorString,in_stack_00000008,argValues);
  Exception::Exception(this_00,type,(char *)ctx,in_EDX,(String *)&local_48);
  this->exception = this_00;
  Array<char>::~Array(&local_48);
  return extraout_EAX;
}

Assistant:

void Debug::Fault::init(
    const char* file, int line, int osErrorNumber,
    const char* condition, const char* macroArgs, ArrayPtr<String> argValues) {
  exception = new Exception(typeOfErrno(osErrorNumber), file, line,
      makeDescriptionImpl(SYSCALL, condition, osErrorNumber, nullptr, macroArgs, argValues));
}